

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O2

void __thiscall TPZFMatrix<long_double>::TPZFMatrix(TPZFMatrix<long_double> *this,void **vtt)

{
  TPZMatrix<long_double>::TPZMatrix(&this->super_TPZMatrix<long_double>,vtt + 1,0,0);
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)*vtt;
  this->fElem = (longdouble *)0x0;
  this->fGiven = (longdouble *)0x0;
  this->fSize = 0;
  TPZManVector<int,_5>::TPZManVector(&this->fPivot,0);
  (this->fWork)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_016491a8;
  (this->fWork).fStore = (longdouble *)0x0;
  (this->fWork).fNElements = 0;
  (this->fWork).fNAlloc = 0;
  return;
}

Assistant:

TPZFMatrix() : TPZRegisterClassId(&TPZFMatrix<TVar>::ClassId),
    TPZMatrix<TVar>( 0, 0 ), fElem(0),fGiven(0),fSize(0) {}